

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O1

void __thiscall kj::AsyncIoStreamWithGuards::whenWriteDisconnected(AsyncIoStreamWithGuards *this)

{
  whenWriteDisconnected(this);
  return;
}

Assistant:

Promise<void> whenWriteDisconnected() override {
    if (writeGuardReleased) {
      return inner->whenWriteDisconnected();
    } else {
      return writeGuard.addBranch().then([this]() {
        return inner->whenWriteDisconnected();
      }, [](kj::Exception&& e) mutable -> kj::Promise<void> {
        if (e.getType() == kj::Exception::Type::DISCONNECTED) {
          return kj::READY_NOW;
        } else {
          return kj::mv(e);
        }
      });
    }
  }